

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmake.cpp
# Opt level: O0

void __thiscall CTcMake::get_srcfile(CTcMake *this,textchar_t *dst,CTcMakeModule *mod)

{
  int iVar1;
  textchar_t *__name;
  char *in_RSI;
  long in_RDI;
  CTcMakePath *path;
  CTcMakeModule *in_stack_ffffffffffffffa8;
  char *in_stack_ffffffffffffffb0;
  char *fullpathbuflen;
  textchar_t *in_stack_ffffffffffffffc0;
  size_t in_stack_ffffffffffffffc8;
  char *in_stack_ffffffffffffffd0;
  CTcMakePath *local_20;
  
  CTcMakeModule::get_search_source_name(in_stack_ffffffffffffffa8);
  iVar1 = os_is_file_absolute((char *)in_stack_ffffffffffffffa8);
  if (iVar1 == 0) {
    __name = CTcMakeModule::get_source_name((CTcMakeModule *)0x2099b9);
    iVar1 = access(__name,0);
    if (iVar1 == 0) {
      CTcMakeModule::get_source_name((CTcMakeModule *)0x2099dc);
      lib_strcpy(in_stack_ffffffffffffffd0,(size_t)in_RSI,in_stack_ffffffffffffffc0);
    }
    else {
      for (local_20 = *(CTcMakePath **)(in_RDI + 0x40); local_20 != (CTcMakePath *)0x0;
          local_20 = CTcMakePath::get_next(local_20)) {
        fullpathbuflen = in_RSI;
        in_stack_ffffffffffffffc0 = CTcMakePath::get_path((CTcMakePath *)0x209a1d);
        CTcMakeModule::get_search_source_name(in_stack_ffffffffffffffa8);
        os_build_full_path(in_stack_ffffffffffffffc0,(size_t)fullpathbuflen,
                           in_stack_ffffffffffffffb0,(char *)in_stack_ffffffffffffffa8);
        iVar1 = access(in_RSI,0);
        if (iVar1 == 0) {
          return;
        }
      }
      CTcMakeModule::get_source_name((CTcMakeModule *)0x209a7d);
      lib_strcpy(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    }
  }
  else {
    CTcMakeModule::get_source_name((CTcMakeModule *)0x209998);
    lib_strcpy(in_RSI,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  }
  return;
}

Assistant:

void CTcMake::get_srcfile(textchar_t *dst, CTcMakeModule *mod)
{
    CTcMakePath *path;
    
    /* 
     *   if the file has an absolute path already, use the name without
     *   further modification; otherwise, apply our default path 
     */
    if (os_is_file_absolute(mod->get_search_source_name()))
    {
        /* it's absolute - ignore the search path */
        lib_strcpy(dst, OSFNMAX, mod->get_source_name());
        return;
    }

    /*
     *   If the file exists with the name as given (in other words, relative
     *   to the current working directory), use the name as given. 
     */
    if (!osfacc(mod->get_source_name()))
    {
        /* the file exists in the current directory - use the name as given */
        lib_strcpy(dst, OSFNMAX, mod->get_source_name());
        return;
    }

    /* search the source path for the file */
    for (path = src_head_ ; path != 0 ; path = path->get_next())
    {
        /* build the full path for this source path */
        os_build_full_path(dst, OSFNMAX, path->get_path(),
                           mod->get_search_source_name());

        /* if the resulting file exists, return it */
        if (!osfacc(dst))
            return;
    }

    /* 
     *   we failed to find the file anywhere - return the name as given,
     *   which will let the caller fail when it can't open the file 
     */
    lib_strcpy(dst, OSFNMAX, mod->get_source_name());
}